

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  ImGuiInputSource IVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  double dVar18;
  float fVar19;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  uVar4 = data_type & 0xfffffffe;
  bVar11 = v_max - v_min != 0;
  if (v_speed == 0.0 && bVar11) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar9 = flags & 1;
  IVar5 = GImGui->ActiveIdSource;
  if (IVar5 == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar3) || ((pIVar2->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar5 = pIVar2->ActiveIdSource;
      goto LAB_0014925d;
    }
    fVar19 = (pIVar2->IO).NavInputs[(ulong)uVar9 + 0x1e];
    if ((pIVar2->IO).KeyAlt != false) {
      fVar19 = fVar19 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar19 = fVar19 * 10.0;
    }
  }
  else {
LAB_0014925d:
    fVar19 = 0.0;
    if (IVar5 == ImGuiInputSource_Nav) {
      uVar6 = 0;
      if (uVar4 == 8) {
        uVar6 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar19 = (&local_38.x)[uVar9];
      if ((int)uVar6 < 0) {
        fVar17 = 1.1754944e-38;
      }
      else if (uVar6 < 10) {
        fVar17 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar6 * 4);
      }
      else {
        fVar17 = powf(10.0,(float)(int)-uVar6);
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar17 <= v_speed) |
                       ~-(uint)(fVar17 <= v_speed) & (uint)fVar17);
    }
  }
  fVar19 = fVar19 * v_speed;
  fVar17 = fVar19;
  if (uVar9 != 0) {
    fVar17 = -fVar19;
  }
  uVar10 = v_max - v_min;
  if (uVar10 == 0) {
    bVar3 = false;
  }
  else if ((*v < v_max) || (bVar3 = true, fVar17 <= 0.0)) {
    bVar3 = fVar17 < 0.0 && *v <= v_min;
  }
  if ((uVar4 != 8 || !bVar11) || power == 1.0) {
LAB_001493ad:
    bVar1 = false;
  }
  else {
    if ((fVar17 < 0.0) && (0.0 < pIVar2->DragCurrentAccum)) goto LAB_001493e1;
    if (fVar17 <= 0.0) goto LAB_001493ad;
    bVar1 = pIVar2->DragCurrentAccum <= 0.0 && pIVar2->DragCurrentAccum != 0.0;
  }
  if (((pIVar2->ActiveIdIsJustActivated & 1U) == 0 && !bVar3) && (!bVar1)) {
    if ((fVar19 != 0.0) || (NAN(fVar19))) {
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar17;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if ((uVar4 != 8 || !bVar11) || power == 1.0) {
      uVar10 = (ulong)pIVar2->DragCurrentAccum;
      uVar7 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                        (format,data_type,
                         *v + ((long)(pIVar2->DragCurrentAccum - 9.223372e+18) &
                               (long)uVar10 >> 0x3f | uVar10));
      pIVar2->DragCurrentAccumDirty = false;
      uVar10 = *v;
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(long)(uVar7 - uVar10);
    }
    else {
      lVar8 = *v - v_min;
      auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar14._0_8_ = lVar8;
      auVar14._12_4_ = 0x45300000;
      auVar15._8_4_ = (int)(uVar10 >> 0x20);
      auVar15._0_8_ = uVar10;
      auVar15._12_4_ = 0x45300000;
      dVar18 = (auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
      dVar13 = pow(((auVar14._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / dVar18,
                   1.0 / (double)power);
      fVar12 = (float)((double)(pIVar2->DragCurrentAccum / (float)uVar10) + dVar13);
      fVar19 = 1.0;
      if (fVar12 <= 1.0) {
        fVar19 = fVar12;
      }
      fVar19 = powf((float)(~-(uint)(fVar12 < 0.0) & (uint)fVar19),power);
      uVar7 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                        (format,data_type,
                         uVar10 * ((long)(fVar19 - 9.223372e+18) & (long)fVar19 >> 0x3f |
                                  (long)fVar19) + v_min);
      pIVar2->DragCurrentAccumDirty = false;
      lVar8 = uVar7 - v_min;
      auVar16._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar16._0_8_ = lVar8;
      auVar16._12_4_ = 0x45300000;
      dVar18 = pow(((auVar16._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / dVar18,
                   1.0 / (double)power);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(dVar18 - dVar13);
      uVar10 = *v;
    }
    if ((v_max != v_min) && (uVar10 != uVar7)) {
      if ((uVar7 < v_min) || (((uVar4 != 8 && (uVar10 < uVar7)) && (fVar17 < 0.0)))) {
        uVar7 = v_min;
      }
      if ((v_max < uVar7) || (((uVar4 != 8 && (uVar7 < uVar10)) && (0.0 < fVar17)))) {
        uVar7 = v_max;
      }
    }
    if (uVar10 == uVar7) {
      return false;
    }
    *v = uVar7;
    return true;
  }
LAB_001493e1:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool has_min_max = (v_min != v_max);
    const bool is_power = (power != 1.0f && is_decimal && has_min_max && (v_max - v_min < FLT_MAX));

    // Default tweak speed
    if (v_speed == 0.0f && has_min_max && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}